

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_seq_executor.cpp
# Opt level: O3

void __thiscall Worker::Worker(Worker *this,string *name)

{
  pointer pcVar1;
  _Bind<void_(Worker::*(Worker_*))()> local_40;
  
  boost::asio::io_context::io_context(&this->m_ios);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  local_40._M_f = 1000;
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_deadline_timer<boost::asio::io_context>
            (&this->m_wrkTimer,&this->m_ios,(duration_type *)&local_40,(type *)0x0);
  local_40._M_f = (offset_in_Worker_to_subr)run;
  local_40._8_8_ = 0;
  local_40._M_bound_args.super__Tuple_impl<0UL,_Worker_*>.super__Head_base<0UL,_Worker_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_Worker_*>)(_Tuple_impl<0UL,_Worker_*>)this;
  std::thread::thread<std::_Bind<void(Worker::*(Worker*))()>,,void>(&this->m_thread,&local_40);
  this->m_stopFlag = false;
  (this->m_pendingJobCount).super___atomic_base<unsigned_long>._M_i = 0;
  (this->m_jobCount).super___atomic_base<unsigned_long>._M_i = 0;
  this->m_processedJobs = 0;
  return;
}

Assistant:

Worker(const std::string& name)
		: m_name {name},
		  m_wrkTimer {m_ios, boost::posix_time::milliseconds(1)},
		  m_thread{std::bind(&Worker::run, this)},
          m_stopFlag{false},
          m_pendingJobCount{0},
          m_jobCount{0},
          m_processedJobs{0}
	{
		//std::cout << "Worker " << name << " is created" << std::endl;
	}